

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O1

bool dxil_spv::emit_wave_match_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  TypeID TVar3;
  Id IVar4;
  Builder *pBVar5;
  Value *pVVar6;
  Type *pTVar7;
  Operation *pOVar8;
  Operation *pOVar9;
  Operation *pOVar10;
  int width;
  Op op;
  Id local_44;
  Capability local_38 [2];
  
  pBVar5 = Converter::Impl::builder(impl);
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar7 = LLVMBC::Value::getType(pVVar6);
  op = OpNop;
  IVar2 = Converter::Impl::get_type_id(impl,pTVar7,0);
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_44 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar7 = LLVMBC::Value::getType(pVVar6);
  TVar3 = LLVMBC::Type::getTypeID(pTVar7);
  if (TVar3 == DoubleTyID) {
    width = 0x40;
  }
  else if (TVar3 == FloatTyID) {
    width = 0x20;
  }
  else {
    if (TVar3 != HalfTyID) {
      bVar1 = true;
      goto LAB_0016e779;
    }
    bVar1 = Converter::Impl::support_native_fp16_operations(impl);
    width = (uint)!bVar1 * 0x10 + 0x10;
  }
  bVar1 = false;
  IVar2 = spv::Builder::makeIntegerType(pBVar5,width,false);
  op = OpBitcast;
LAB_0016e779:
  if (!bVar1) {
    pOVar8 = Converter::Impl::allocate(impl,op,IVar2);
    Operation::add_id(pOVar8,local_44);
    local_44 = pOVar8->id;
    Converter::Impl::add(impl,pOVar8,false);
  }
  if ((impl->options).nv_subgroup_partition_enabled == true) {
    spv::Builder::addExtension(pBVar5,"SPV_NV_shader_subgroup_partitioned");
    local_38[0] = CapabilityGroupNonUniformPartitionedNV;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar5->capabilities,local_38);
    IVar2 = spv::Builder::makeIntegerType(pBVar5,0x20,false);
    IVar2 = spv::Builder::makeVectorType(pBVar5,IVar2,4);
    pOVar8 = Converter::Impl::allocate(impl,OpGroupNonUniformPartitionNV,(Value *)instruction,IVar2)
    ;
    Operation::add_id(pOVar8,local_44);
    Converter::Impl::add(impl,pOVar8,false);
    if (((impl->execution_model == ExecutionModelFragment) &&
        ((impl->options).strict_helper_lane_waveops == true)) &&
       (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
      IVar2 = spv::Builder::makeBoolType(pBVar5);
      pOVar9 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar2);
      Converter::Impl::add(impl,pOVar9,false);
      IVar2 = spv::Builder::makeBoolType(pBVar5);
      pOVar10 = Converter::Impl::allocate(impl,OpLogicalNot,IVar2);
      Operation::add_id(pOVar10,pOVar9->id);
      Converter::Impl::add(impl,pOVar10,false);
      IVar2 = spv::Builder::makeIntegerType(pBVar5,0x20,false);
      IVar2 = spv::Builder::makeVectorType(pBVar5,IVar2,4);
      pOVar9 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar2);
      IVar2 = spv::Builder::makeIntegerType(pBVar5,0x20,false);
      IVar2 = spv::Builder::makeIntConstant(pBVar5,IVar2,3,false);
      Operation::add_id(pOVar9,IVar2);
      Operation::add_id(pOVar9,pOVar10->id);
      Converter::Impl::add(impl,pOVar9,false);
      local_38[1] = 0x40;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar5->capabilities,local_38 + 1);
      IVar2 = spv::Builder::makeIntegerType(pBVar5,0x20,false);
      IVar2 = spv::Builder::makeVectorType(pBVar5,IVar2,4);
      pOVar10 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar2);
      Operation::add_id(pOVar10,pOVar8->id);
      Operation::add_id(pOVar10,pOVar9->id);
      Converter::Impl::add(impl,pOVar10,false);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar10->id);
    }
  }
  else {
    IVar2 = SPIRVModule::get_helper_call_id(impl->spirv_module,WaveMatch,IVar2);
    IVar4 = spv::Builder::makeIntegerType(pBVar5,0x20,false);
    IVar4 = spv::Builder::makeVectorType(pBVar5,IVar4,4);
    pOVar8 = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)instruction,IVar4);
    Operation::add_id(pOVar8,IVar2);
    Operation::add_id(pOVar8,local_44);
    if (((impl->execution_model == ExecutionModelFragment) &&
        ((impl->options).strict_helper_lane_waveops == true)) &&
       (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
      pBVar5 = Converter::Impl::builder(impl);
      IVar2 = spv::Builder::makeBoolType(pBVar5);
      pOVar9 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar2);
      Converter::Impl::add(impl,pOVar9,false);
      Operation::add_id(pOVar8,pOVar9->id);
    }
    Converter::Impl::add(impl,pOVar8,false);
  }
  return true;
}

Assistant:

bool emit_wave_match_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id type_id = impl.get_type_id(instruction->getOperand(1)->getType());
	spv::Id value_id = impl.get_id_for_value(instruction->getOperand(1));

	// It's not safe to use FOrdEqual since a loop with NaN will never compare equal to BroadcastFirst().
	// Make sure we compare equal with uint.
	spv::Op cast_op = spv::OpNop;
	switch (instruction->getOperand(1)->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		type_id = builder.makeUintType(impl.support_native_fp16_operations() ? 16 : 32);
		cast_op = spv::OpBitcast;
		break;

	case llvm::Type::TypeID::FloatTyID:
		type_id = builder.makeUintType(32);
		cast_op = spv::OpBitcast;
		break;

	case llvm::Type::TypeID::DoubleTyID:
		type_id = builder.makeUintType(64);
		cast_op = spv::OpBitcast;
		break;

	default:
		break;
	}

	if (cast_op != spv::OpNop)
	{
		auto *bitcast_op = impl.allocate(cast_op, type_id);
		bitcast_op->add_id(value_id);
		value_id = bitcast_op->id;
		impl.add(bitcast_op);
	}

	if (impl.options.nv_subgroup_partition_enabled)
	{
		builder.addExtension("SPV_NV_shader_subgroup_partitioned");
		builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
		auto *op = impl.allocate(spv::OpGroupNonUniformPartitionNV, instruction,
		                         builder.makeVectorType(builder.makeUintType(32), 4));
		op->add_id(value_id);
		impl.add(op);

		if (wave_op_needs_helper_lane_masking(impl))
		{
			auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, builder.makeBoolType());
			impl.add(is_helper_lane);

			auto *not_op = impl.allocate(spv::OpLogicalNot, builder.makeBoolType());
			not_op->add_id(is_helper_lane->id);
			impl.add(not_op);

			auto *non_helper_op = impl.allocate(spv::OpGroupNonUniformBallot,
			                                    builder.makeVectorType(builder.makeUintType(32), 4));
			non_helper_op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
			non_helper_op->add_id(not_op->id);
			impl.add(non_helper_op);
			builder.addCapability(spv::CapabilityGroupNonUniformBallot);

			auto *and_op = impl.allocate(spv::OpBitwiseAnd, builder.makeVectorType(builder.makeUintType(32), 4));
			and_op->add_id(op->id);
			and_op->add_id(non_helper_op->id);
			impl.add(and_op);

			impl.rewrite_value(instruction, and_op->id);
		}
	}
	else
	{
		spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::WaveMatch, type_id);
		auto *call_op =
		    impl.allocate(spv::OpFunctionCall, instruction, builder.makeVectorType(builder.makeUintType(32), 4));
		call_op->add_id(call_id);
		call_op->add_id(value_id);

		if (wave_op_needs_helper_lane_masking(impl))
		{
			auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
			impl.add(is_helper_lane);
			call_op->add_id(is_helper_lane->id);
		}

		impl.add(call_op);
	}

	return true;
}